

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_text(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *this,iterator begin,iterator end)

{
  null_terminating_iterator<char> __first;
  difference_type value;
  type n;
  char *pcVar1;
  type local_60;
  type *local_58;
  type *it;
  iterator out;
  type size;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  iterator end_local;
  iterator begin_local;
  
  end_local.ptr_ = end.end_;
  this_local = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                *)end.ptr_;
  out.container = (basic_buffer<char> *)begin.ptr_;
  end_local.end_ = (char *)out.container;
  value = internal::null_terminating_iterator<char>::operator-
                    ((null_terminating_iterator<char> *)&this_local,begin);
  n = internal::to_unsigned<long>(value);
  it = (type *)internal::
               context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ::out(&(this->context).
                      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                    );
  local_60 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)&it,n);
  local_58 = &local_60;
  __first.end_ = begin.end_;
  __first.ptr_ = end_local.end_;
  pcVar1 = std::copy_n<fmt::v5::internal::null_terminating_iterator<char>,unsigned_long,char*>
                     (__first,n,local_60);
  *local_58 = pcVar1;
  internal::
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::advance_to(&(this->context).
                super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ,(iterator)it);
  return;
}

Assistant:

void on_text(iterator begin, iterator end) {
    auto size = internal::to_unsigned(end - begin);
    auto out = context.out();
    auto &&it = internal::reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }